

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrixCorotation.cpp
# Opt level: O1

void chrono::fea::ChMatrixCorotation::ComputeKCt
               (ChMatrixConstRef K,ChMatrix33<double> *R,int nblocks,ChMatrixRef *KC)

{
  undefined1 auVar1 [16];
  long lVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  ulong local_48;
  
  uVar3 = 0;
  if (0 < nblocks) {
    lVar2 = (K->
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_rows.m_value;
    uVar4 = (uint)lVar2;
    lVar6 = 0;
    local_48 = 0;
    do {
      if (0 < (int)uVar4) {
        lVar10 = 0;
        uVar11 = 0;
        do {
          lVar9 = 0;
          pdVar8 = (double *)R;
          do {
            if (lVar2 <= (long)uVar11) {
LAB_0062acac:
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                            "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, 0>::operator()(Index, Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                           );
            }
            uVar7 = (K->
                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    ).
                    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_cols.m_value;
            if ((long)uVar7 <= (long)uVar3) {
              uVar7 = uVar3;
            }
            auVar12 = ZEXT864(0) << 0x40;
            lVar5 = 0;
            do {
              if (uVar7 - uVar3 < 3) goto LAB_0062acac;
              auVar13._8_8_ = 0;
              auVar13._0_8_ =
                   *(ulong *)((long)(K->
                                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                    ).
                                    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                    .m_data +
                             lVar5 * 8 +
                             (K->
                             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                             ).m_stride.m_outer.m_value * lVar10 + lVar6);
              auVar1._8_8_ = 0;
              auVar1._0_8_ = pdVar8[lVar5];
              auVar1 = vfmadd231sd_fma(auVar12._0_16_,auVar13,auVar1);
              auVar12 = ZEXT1664(auVar1);
              lVar5 = lVar5 + 1;
            } while (lVar5 != 3);
            if (((KC->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_rows.m_value <= (long)uVar11) ||
               (lVar5 = lVar9 + local_48 * 3,
               (KC->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_cols.m_value <= lVar5)) {
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                           );
            }
            (KC->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_data[lVar5 + (KC->
                            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                            ).m_stride.m_outer.m_value * uVar11] = auVar1._0_8_;
            lVar9 = lVar9 + 1;
            pdVar8 = pdVar8 + 3;
          } while (lVar9 != 3);
          uVar11 = uVar11 + 1;
          lVar10 = lVar10 + 8;
        } while (uVar11 != (~((int)uVar4 >> 0x1f) & uVar4));
      }
      local_48 = local_48 + 1;
      uVar3 = (ulong)((int)uVar3 + 3);
      lVar6 = lVar6 + 0x18;
    } while (local_48 != (uint)nblocks);
  }
  return;
}

Assistant:

void ChMatrixCorotation::ComputeKCt(ChMatrixConstRef K,     // matrix to corotate
                                    const ChMatrix33<>& R,  // 3x3 rotation matrix (will be used transposed)
                                    const int nblocks,      // number of rotation blocks
                                    ChMatrixRef KC          // result matrix: C*K
) {
    for (int iblock = 0; iblock < nblocks; iblock++) {
        double sum;
        for (int rowres = 0; rowres < (int)K.rows(); ++rowres)
            for (int row = 0; row < 3; ++row) {
                sum = 0;
                for (int col = 0; col < 3; ++col)
                    sum += K(rowres, col + (3 * iblock)) * R(row, col);
                KC(rowres, row + (3 * iblock)) = sum;
            }
    }
}